

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O3

void opj_t1_clbl_decode_processor(void *user_data,opj_tls_t *tls)

{
  opj_flag_t *flagsp;
  byte bVar1;
  int iVar2;
  float fVar3;
  uint uVar4;
  opj_tcd_cblk_dec_t *cblk;
  int *piVar5;
  opj_event_mgr_t *p_manager;
  opj_mutex_t *p_manager_mutex;
  float *pfVar6;
  opj_tcd_seg_t *poVar7;
  opj_mqc_state_t *poVar8;
  byte *pbVar9;
  bool bVar10;
  OPJ_BOOL OVar11;
  OPJ_BOOL OVar12;
  uint uVar13;
  OPJ_INT32 *data;
  opj_t1_t *p_t1;
  OPJ_BYTE *pOVar14;
  opj_tcd_seg_data_chunk_t *poVar15;
  long lVar16;
  uint *puVar17;
  uint *puVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  OPJ_UINT32 *pOVar24;
  uint uVar25;
  opj_flag_t oVar26;
  ulong uVar27;
  float *pfVar28;
  uint uVar29;
  opj_flag_t *flagsp_00;
  uint uVar30;
  uint uVar31;
  float fVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  uint *puVar37;
  uint uVar38;
  uint uVar39;
  opj_mqc_state_t **ppoVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  OPJ_BYTE *pOVar44;
  uint uVar45;
  ulong uVar46;
  OPJ_INT32 *pOVar47;
  ulong uVar48;
  uint uVar49;
  uint uVar50;
  uint *puVar51;
  OPJ_UINT32 OVar52;
  OPJ_UINT32 OVar53;
  size_t size;
  opj_mqc_t *mqc;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  float fVar57;
  uint local_ec;
  OPJ_INT32 *local_88;
  
  cblk = *(opj_tcd_cblk_dec_t **)((long)user_data + 8);
  if (*user_data == 0) {
    size = (ulong)(uint)(cblk->y1 - cblk->y0) * (ulong)(uint)(cblk->x1 - cblk->x0) * 4;
    pOVar47 = (OPJ_INT32 *)opj_aligned_malloc(size);
    cblk->decoded_data = pOVar47;
    if (pOVar47 != (OPJ_INT32 *)0x0) {
      memset(pOVar47,0,size);
      goto LAB_0012d337;
    }
    if (*(opj_mutex_t **)((long)user_data + 0x40) != (opj_mutex_t *)0x0) {
      opj_mutex_lock(*(opj_mutex_t **)((long)user_data + 0x40));
    }
    opj_event_msg(*(opj_event_mgr_t **)((long)user_data + 0x38),1,
                  "Cannot allocate cblk->decoded_data\n");
    if (*(opj_mutex_t **)((long)user_data + 0x40) != (opj_mutex_t *)0x0) {
      opj_mutex_unlock(*(opj_mutex_t **)((long)user_data + 0x40));
    }
    goto LAB_0012da33;
  }
  if (cblk->decoded_data != (OPJ_INT32 *)0x0) {
    opj_aligned_free(cblk->decoded_data);
    cblk->decoded_data = (OPJ_INT32 *)0x0;
  }
LAB_0012d337:
  iVar2 = *(int *)((long)user_data + 4);
  piVar5 = *(int **)((long)user_data + 0x10);
  lVar16 = *(long *)((long)user_data + 0x18);
  lVar43 = *(long *)((long)user_data + 0x20);
  lVar23 = (ulong)(*(int *)(lVar16 + 0x18) - 1) * 0xc0;
  uVar33 = *(int *)(*(long *)(lVar16 + 0x20) + 8 + lVar23) -
           *(int *)(*(long *)(lVar16 + 0x20) + lVar23);
  if (**(int **)((long)user_data + 0x30) == 0) goto LAB_0012da41;
  p_t1 = (opj_t1_t *)opj_tls_get(tls,0);
  if (p_t1 == (opj_t1_t *)0x0) {
    p_t1 = (opj_t1_t *)opj_calloc(1,0x110);
    if (p_t1 == (opj_t1_t *)0x0) {
      opj_event_msg(*(opj_event_mgr_t **)((long)user_data + 0x38),1,
                    "Cannot allocate Tier 1 handle\n");
    }
    else {
      p_t1->encoder = 0;
      OVar12 = opj_tls_set(tls,0,p_t1,opj_t1_destroy_wrapper);
      if (OVar12 != 0) goto LAB_0012d3a2;
      opj_event_msg(*(opj_event_mgr_t **)((long)user_data + 0x38),1,
                    "Unable to set t1 handle as TLS\n");
      opj_t1_destroy(p_t1);
    }
    goto LAB_0012da33;
  }
LAB_0012d3a2:
  p_t1->mustuse_cblkdatabuffer = *(OPJ_BOOL *)((long)user_data + 0x28);
  uVar34 = *(uint *)(lVar43 + 0x10);
  OVar53 = *(OPJ_UINT32 *)(lVar43 + 0x328);
  p_manager = *(opj_event_mgr_t **)((long)user_data + 0x38);
  p_manager_mutex = *(opj_mutex_t **)((long)user_data + 0x40);
  OVar12 = *(OPJ_BOOL *)((long)user_data + 0x48);
  if ((uVar34 & 0x40) == 0) {
    (p_t1->mqc).lut_ctxno_zc_orient = "" + (uint)(piVar5[4] << 9);
    OVar11 = opj_t1_allocate_buffers(p_t1,cblk->x1 - cblk->x0,cblk->y1 - cblk->y0);
    if (OVar11 != 0) {
      uVar49 = OVar53 + cblk->numbps;
      if ((int)uVar49 < 0x1f) {
        opj_mqc_resetstates(&p_t1->mqc);
        uVar36 = 0;
        opj_mqc_setstate(&p_t1->mqc,0x12,0,0x2e);
        opj_mqc_setstate(&p_t1->mqc,0x11,0,3);
        opj_mqc_setstate(&p_t1->mqc,0,0,4);
        uVar31 = cblk->numchunks;
        uVar27 = (ulong)uVar31;
        if (uVar27 < 2) {
          if (p_t1->mustuse_cblkdatabuffer != 0) {
            if (uVar31 != 0) goto LAB_0012d6a3;
            uVar36 = 0;
            goto LAB_0012d6b9;
          }
          if (uVar31 != 1) goto LAB_0012d4a0;
          pOVar14 = cblk->chunks->data;
        }
        else {
LAB_0012d6a3:
          pOVar24 = &cblk->chunks->len;
          do {
            uVar36 = (ulong)((int)uVar36 + *pOVar24);
            pOVar24 = pOVar24 + 4;
            uVar27 = uVar27 - 1;
          } while (uVar27 != 0);
LAB_0012d6b9:
          uVar30 = (int)uVar36 + 2;
          if (p_t1->cblkdatabuffersize < uVar30) {
            pOVar14 = (OPJ_BYTE *)opj_realloc(p_t1->cblkdatabuffer,(ulong)uVar30);
            if (pOVar14 == (OPJ_BYTE *)0x0) goto LAB_0012da33;
            p_t1->cblkdatabuffer = pOVar14;
            (pOVar14 + uVar36)[0] = '\0';
            (pOVar14 + uVar36)[1] = '\0';
            p_t1->cblkdatabuffersize = uVar30;
            uVar31 = cblk->numchunks;
          }
          pOVar14 = p_t1->cblkdatabuffer;
          if (uVar31 != 0) {
            poVar15 = cblk->chunks;
            uVar27 = 0;
            lVar23 = 8;
            uVar31 = 0;
            do {
              memcpy(pOVar14 + uVar31,*(void **)((long)poVar15 + lVar23 + -8),
                     (ulong)*(uint *)((long)&poVar15->data + lVar23));
              poVar15 = cblk->chunks;
              uVar31 = uVar31 + *(int *)((long)&poVar15->data + lVar23);
              uVar27 = uVar27 + 1;
              lVar23 = lVar23 + 0x10;
            } while (uVar27 < cblk->numchunks);
          }
        }
        if (cblk->decoded_data == (OPJ_INT32 *)0x0) {
          local_88 = (OPJ_INT32 *)0x0;
        }
        else {
          local_88 = p_t1->data;
          p_t1->data = cblk->decoded_data;
        }
        if (cblk->real_num_segs != 0) {
          uVar31 = 2;
          uVar27 = 0;
          local_ec = 0;
          do {
            bVar56 = (uVar34 & 1) == 0;
            poVar7 = cblk->segs;
            bVar10 = (int)(cblk->numbps - 4) < (int)uVar49;
            bVar54 = 1 < uVar31;
            OVar53 = poVar7[uVar27].len;
            if ((bVar54 || bVar56) || bVar10) {
              opj_mqc_init_dec(&p_t1->mqc,pOVar14 + local_ec,OVar53,2);
            }
            else {
              opj_mqc_raw_init_dec(&p_t1->mqc,pOVar14 + local_ec,OVar53,2);
            }
            poVar7 = poVar7 + uVar27;
            local_ec = local_ec + poVar7->len;
            if ((0 < (int)uVar49) && (poVar7->real_num_passes != 0)) {
              uVar30 = 0;
              do {
                if (uVar31 == 2) {
                  opj_t1_dec_clnpass(p_t1,uVar49,uVar34);
                }
                else {
                  bVar19 = (byte)uVar49;
                  if (uVar31 == 1) {
                    if ((bVar54 || bVar56) || bVar10) {
                      uVar25 = p_t1->w;
                      uVar36 = (ulong)uVar25;
                      uVar50 = p_t1->h;
                      puVar18 = (uint *)p_t1->data;
                      if (uVar50 == 0x40 && uVar25 == 0x40) {
                        puVar37 = p_t1->flags + 0x43;
                        ppoVar40 = (p_t1->mqc).curctx;
                        uVar25 = (p_t1->mqc).c;
                        uVar50 = (p_t1->mqc).a;
                        OVar53 = (p_t1->mqc).ct;
                        uVar35 = (uint)(1 << (bVar19 & 0x1f)) >> 1;
                        uVar20 = -uVar35;
                        uVar45 = 0;
                        do {
                          iVar42 = 0;
                          do {
                            puVar51 = puVar37;
                            puVar17 = puVar18;
                            uVar13 = *puVar51;
                            if (uVar13 != 0) {
                              if ((uVar13 & 0x200010) == 0x10) {
                                uVar39 = 0xf - ((uVar13 & 0x1ef) == 0);
                                if ((uVar13 >> 0x14 & 1) != 0) {
                                  uVar39 = 0x10;
                                }
                                ppoVar40 = (p_t1->mqc).ctxs + uVar39;
                                poVar8 = *ppoVar40;
                                uVar39 = poVar8->qeval;
                                uVar29 = uVar50 - uVar39;
                                if (uVar25 >> 0x10 < uVar39) {
                                  uVar22 = poVar8->mps;
                                  *ppoVar40 = (&poVar8->nmps)[uVar39 <= uVar29];
                                  uVar50 = uVar39;
                                  do {
                                    if (OVar53 == 0) {
                                      pOVar44 = (p_t1->mqc).bp;
                                      bVar19 = pOVar44[1];
                                      if (*pOVar44 == 0xff) {
                                        if (bVar19 < 0x90) {
                                          (p_t1->mqc).bp = pOVar44 + 1;
                                          uVar25 = uVar25 + (uint)bVar19 * 0x200;
                                          OVar53 = 7;
                                          goto LAB_0012dc9b;
                                        }
                                        uVar25 = uVar25 + 0xff00;
                                        pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                        *pOVar24 = *pOVar24 + 1;
                                      }
                                      else {
                                        (p_t1->mqc).bp = pOVar44 + 1;
                                        uVar25 = uVar25 + (uint)bVar19 * 0x100;
                                      }
                                      OVar53 = 8;
                                    }
LAB_0012dc9b:
                                    uVar50 = uVar50 * 2;
                                    uVar25 = uVar25 * 2;
                                    OVar53 = OVar53 - 1;
                                  } while (uVar50 < 0x8000);
                                  uVar38 = (uint)(uVar22 == 0);
                                  if (uVar29 < uVar39) {
                                    uVar38 = uVar22;
                                  }
                                }
                                else {
                                  uVar25 = uVar25 + uVar39 * -0x10000;
                                  uVar50 = uVar29;
                                  if ((short)uVar29 < 0) {
                                    uVar38 = poVar8->mps;
                                  }
                                  else {
                                    uVar22 = poVar8->mps;
                                    *ppoVar40 = (&poVar8->nmps)[uVar29 < uVar39];
                                    do {
                                      if (OVar53 == 0) {
                                        pOVar44 = (p_t1->mqc).bp;
                                        bVar19 = pOVar44[1];
                                        if (*pOVar44 == 0xff) {
                                          if (bVar19 < 0x90) {
                                            (p_t1->mqc).bp = pOVar44 + 1;
                                            uVar25 = uVar25 + (uint)bVar19 * 0x200;
                                            OVar53 = 7;
                                            goto LAB_0012dd20;
                                          }
                                          uVar25 = uVar25 + 0xff00;
                                          pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                          *pOVar24 = *pOVar24 + 1;
                                        }
                                        else {
                                          (p_t1->mqc).bp = pOVar44 + 1;
                                          uVar25 = uVar25 + (uint)bVar19 * 0x100;
                                        }
                                        OVar53 = 8;
                                      }
LAB_0012dd20:
                                      uVar50 = uVar50 * 2;
                                      uVar25 = uVar25 * 2;
                                      OVar53 = OVar53 - 1;
                                    } while (uVar50 < 0x8000);
                                    uVar38 = (uint)(uVar22 == 0);
                                    if (uVar39 <= uVar29) {
                                      uVar38 = uVar22;
                                    }
                                  }
                                }
                                uVar39 = uVar35;
                                if (uVar38 == *puVar17 >> 0x1f) {
                                  uVar39 = uVar20;
                                }
                                *puVar17 = uVar39 + *puVar17;
                                uVar13 = uVar13 | 0x100000;
                              }
                              if ((uVar13 & 0x1000080) == 0x80) {
                                uVar36 = (ulong)(0xf - ((uVar13 & 0xf78) == 0));
                                if ((uVar13 >> 0x17 & 1) != 0) {
                                  uVar36 = 0x10;
                                }
                                ppoVar40 = (p_t1->mqc).ctxs + uVar36;
                                poVar8 = *ppoVar40;
                                uVar39 = poVar8->qeval;
                                uVar29 = uVar50 - uVar39;
                                if (uVar25 >> 0x10 < uVar39) {
                                  uVar22 = poVar8->mps;
                                  *ppoVar40 = (&poVar8->nmps)[uVar39 <= uVar29];
                                  uVar50 = uVar39;
                                  do {
                                    if (OVar53 == 0) {
                                      pOVar44 = (p_t1->mqc).bp;
                                      bVar19 = pOVar44[1];
                                      if (*pOVar44 == 0xff) {
                                        if (bVar19 < 0x90) {
                                          (p_t1->mqc).bp = pOVar44 + 1;
                                          uVar25 = uVar25 + (uint)bVar19 * 0x200;
                                          OVar53 = 7;
                                          goto LAB_0012de20;
                                        }
                                        uVar25 = uVar25 + 0xff00;
                                        pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                        *pOVar24 = *pOVar24 + 1;
                                      }
                                      else {
                                        (p_t1->mqc).bp = pOVar44 + 1;
                                        uVar25 = uVar25 + (uint)bVar19 * 0x100;
                                      }
                                      OVar53 = 8;
                                    }
LAB_0012de20:
                                    uVar50 = uVar50 * 2;
                                    uVar25 = uVar25 * 2;
                                    OVar53 = OVar53 - 1;
                                  } while (uVar50 < 0x8000);
                                  uVar38 = (uint)(uVar22 == 0);
                                  if (uVar29 < uVar39) {
                                    uVar38 = uVar22;
                                  }
                                }
                                else {
                                  uVar25 = uVar25 + uVar39 * -0x10000;
                                  uVar50 = uVar29;
                                  if ((short)uVar29 < 0) {
                                    uVar38 = poVar8->mps;
                                  }
                                  else {
                                    uVar22 = poVar8->mps;
                                    *ppoVar40 = (&poVar8->nmps)[uVar29 < uVar39];
                                    do {
                                      if (OVar53 == 0) {
                                        pOVar44 = (p_t1->mqc).bp;
                                        bVar19 = pOVar44[1];
                                        if (*pOVar44 == 0xff) {
                                          if (bVar19 < 0x90) {
                                            (p_t1->mqc).bp = pOVar44 + 1;
                                            uVar25 = uVar25 + (uint)bVar19 * 0x200;
                                            OVar53 = 7;
                                            goto LAB_0012dea5;
                                          }
                                          uVar25 = uVar25 + 0xff00;
                                          pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                          *pOVar24 = *pOVar24 + 1;
                                        }
                                        else {
                                          (p_t1->mqc).bp = pOVar44 + 1;
                                          uVar25 = uVar25 + (uint)bVar19 * 0x100;
                                        }
                                        OVar53 = 8;
                                      }
LAB_0012dea5:
                                      uVar50 = uVar50 * 2;
                                      uVar25 = uVar25 * 2;
                                      OVar53 = OVar53 - 1;
                                    } while (uVar50 < 0x8000);
                                    uVar38 = (uint)(uVar22 == 0);
                                    if (uVar39 <= uVar29) {
                                      uVar38 = uVar22;
                                    }
                                  }
                                }
                                uVar39 = uVar35;
                                if (uVar38 == puVar17[0x40] >> 0x1f) {
                                  uVar39 = uVar20;
                                }
                                puVar17[0x40] = uVar39 + puVar17[0x40];
                                uVar13 = uVar13 | 0x800000;
                              }
                              if ((uVar13 & 0x8000400) == 0x400) {
                                uVar36 = (ulong)(0xf - ((uVar13 & 0x7bc0) == 0));
                                if ((uVar13 >> 0x1a & 1) != 0) {
                                  uVar36 = 0x10;
                                }
                                ppoVar40 = (p_t1->mqc).ctxs + uVar36;
                                poVar8 = *ppoVar40;
                                uVar39 = poVar8->qeval;
                                uVar29 = uVar50 - uVar39;
                                if (uVar25 >> 0x10 < uVar39) {
                                  uVar22 = poVar8->mps;
                                  *ppoVar40 = (&poVar8->nmps)[uVar39 <= uVar29];
                                  uVar50 = uVar39;
                                  do {
                                    if (OVar53 == 0) {
                                      pOVar44 = (p_t1->mqc).bp;
                                      bVar19 = pOVar44[1];
                                      if (*pOVar44 == 0xff) {
                                        if (bVar19 < 0x90) {
                                          (p_t1->mqc).bp = pOVar44 + 1;
                                          uVar25 = uVar25 + (uint)bVar19 * 0x200;
                                          OVar53 = 7;
                                          goto LAB_0012dfad;
                                        }
                                        uVar25 = uVar25 + 0xff00;
                                        pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                        *pOVar24 = *pOVar24 + 1;
                                      }
                                      else {
                                        (p_t1->mqc).bp = pOVar44 + 1;
                                        uVar25 = uVar25 + (uint)bVar19 * 0x100;
                                      }
                                      OVar53 = 8;
                                    }
LAB_0012dfad:
                                    uVar50 = uVar50 * 2;
                                    uVar25 = uVar25 * 2;
                                    OVar53 = OVar53 - 1;
                                  } while (uVar50 < 0x8000);
                                  uVar38 = (uint)(uVar22 == 0);
                                  if (uVar29 < uVar39) {
                                    uVar38 = uVar22;
                                  }
                                }
                                else {
                                  uVar25 = uVar25 + uVar39 * -0x10000;
                                  uVar50 = uVar29;
                                  if ((short)uVar29 < 0) {
                                    uVar38 = poVar8->mps;
                                  }
                                  else {
                                    uVar22 = poVar8->mps;
                                    *ppoVar40 = (&poVar8->nmps)[uVar29 < uVar39];
                                    do {
                                      if (OVar53 == 0) {
                                        pOVar44 = (p_t1->mqc).bp;
                                        bVar19 = pOVar44[1];
                                        if (*pOVar44 == 0xff) {
                                          if (bVar19 < 0x90) {
                                            (p_t1->mqc).bp = pOVar44 + 1;
                                            uVar25 = uVar25 + (uint)bVar19 * 0x200;
                                            OVar53 = 7;
                                            goto LAB_0012e032;
                                          }
                                          uVar25 = uVar25 + 0xff00;
                                          pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                          *pOVar24 = *pOVar24 + 1;
                                        }
                                        else {
                                          (p_t1->mqc).bp = pOVar44 + 1;
                                          uVar25 = uVar25 + (uint)bVar19 * 0x100;
                                        }
                                        OVar53 = 8;
                                      }
LAB_0012e032:
                                      uVar50 = uVar50 * 2;
                                      uVar25 = uVar25 * 2;
                                      OVar53 = OVar53 - 1;
                                    } while (uVar50 < 0x8000);
                                    uVar38 = (uint)(uVar22 == 0);
                                    if (uVar39 <= uVar29) {
                                      uVar38 = uVar22;
                                    }
                                  }
                                }
                                uVar39 = uVar35;
                                if (uVar38 == puVar17[0x80] >> 0x1f) {
                                  uVar39 = uVar20;
                                }
                                puVar17[0x80] = uVar39 + puVar17[0x80];
                                uVar13 = uVar13 | 0x4000000;
                              }
                              if ((uVar13 & 0x40002000) == 0x2000) {
                                uVar36 = (ulong)(0xf - ((uVar13 & 0x3de00) == 0));
                                if ((uVar13 >> 0x1d & 1) != 0) {
                                  uVar36 = 0x10;
                                }
                                ppoVar40 = (p_t1->mqc).ctxs + uVar36;
                                poVar8 = *ppoVar40;
                                uVar39 = poVar8->qeval;
                                uVar29 = uVar50 - uVar39;
                                if (uVar25 >> 0x10 < uVar39) {
                                  uVar22 = poVar8->mps;
                                  *ppoVar40 = (&poVar8->nmps)[uVar39 <= uVar29];
                                  uVar50 = uVar39;
                                  do {
                                    if (OVar53 == 0) {
                                      pOVar44 = (p_t1->mqc).bp;
                                      bVar19 = pOVar44[1];
                                      if (*pOVar44 == 0xff) {
                                        if (bVar19 < 0x90) {
                                          (p_t1->mqc).bp = pOVar44 + 1;
                                          uVar25 = uVar25 + (uint)bVar19 * 0x200;
                                          OVar53 = 7;
                                          goto LAB_0012e13a;
                                        }
                                        uVar25 = uVar25 + 0xff00;
                                        pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                        *pOVar24 = *pOVar24 + 1;
                                      }
                                      else {
                                        (p_t1->mqc).bp = pOVar44 + 1;
                                        uVar25 = uVar25 + (uint)bVar19 * 0x100;
                                      }
                                      OVar53 = 8;
                                    }
LAB_0012e13a:
                                    uVar50 = uVar50 * 2;
                                    uVar25 = uVar25 * 2;
                                    OVar53 = OVar53 - 1;
                                  } while (uVar50 < 0x8000);
                                  uVar38 = (uint)(uVar22 == 0);
                                  if (uVar29 < uVar39) {
                                    uVar38 = uVar22;
                                  }
                                }
                                else {
                                  uVar25 = uVar25 + uVar39 * -0x10000;
                                  uVar50 = uVar29;
                                  if ((short)uVar29 < 0) {
                                    uVar38 = poVar8->mps;
                                  }
                                  else {
                                    uVar22 = poVar8->mps;
                                    *ppoVar40 = (&poVar8->nmps)[uVar29 < uVar39];
                                    do {
                                      if (OVar53 == 0) {
                                        pOVar44 = (p_t1->mqc).bp;
                                        bVar19 = pOVar44[1];
                                        if (*pOVar44 == 0xff) {
                                          if (bVar19 < 0x90) {
                                            (p_t1->mqc).bp = pOVar44 + 1;
                                            uVar25 = uVar25 + (uint)bVar19 * 0x200;
                                            OVar53 = 7;
                                            goto LAB_0012e1bf;
                                          }
                                          uVar25 = uVar25 + 0xff00;
                                          pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                          *pOVar24 = *pOVar24 + 1;
                                        }
                                        else {
                                          (p_t1->mqc).bp = pOVar44 + 1;
                                          uVar25 = uVar25 + (uint)bVar19 * 0x100;
                                        }
                                        OVar53 = 8;
                                      }
LAB_0012e1bf:
                                      uVar50 = uVar50 * 2;
                                      uVar25 = uVar25 * 2;
                                      OVar53 = OVar53 - 1;
                                    } while (uVar50 < 0x8000);
                                    uVar38 = (uint)(uVar22 == 0);
                                    if (uVar39 <= uVar29) {
                                      uVar38 = uVar22;
                                    }
                                  }
                                }
                                uVar39 = uVar35;
                                if (uVar38 == puVar17[0xc0] >> 0x1f) {
                                  uVar39 = uVar20;
                                }
                                puVar17[0xc0] = uVar39 + puVar17[0xc0];
                                uVar13 = uVar13 | 0x20000000;
                              }
                              *puVar51 = uVar13;
                            }
                            iVar42 = iVar42 + 1;
                            puVar18 = puVar17 + 1;
                            puVar37 = puVar51 + 1;
                          } while (iVar42 != 0x40);
                          puVar18 = puVar17 + 0xc1;
                          puVar37 = puVar51 + 3;
                          bVar55 = uVar45 < 0x3c;
                          uVar45 = uVar45 + 4;
                        } while (bVar55);
                        (p_t1->mqc).curctx = ppoVar40;
                        (p_t1->mqc).c = uVar25;
                        (p_t1->mqc).a = uVar50;
                        (p_t1->mqc).ct = OVar53;
                      }
                      else {
                        puVar37 = p_t1->flags + (uVar25 + 3);
                        ppoVar40 = (p_t1->mqc).curctx;
                        uVar45 = (p_t1->mqc).c;
                        uVar46 = (ulong)uVar45;
                        uVar20 = (p_t1->mqc).a;
                        OVar53 = (p_t1->mqc).ct;
                        uVar13 = (uint)(1 << (bVar19 & 0x1f)) >> 1;
                        uVar35 = 0;
                        if (3 < uVar50) {
                          uVar29 = -uVar13;
                          uVar39 = uVar25 * 3;
                          uVar35 = 0;
                          do {
                            if (uVar36 != 0) {
                              uVar50 = 0;
                              do {
                                uVar45 = *puVar37;
                                if (uVar45 != 0) {
                                  if ((uVar45 & 0x200010) == 0x10) {
                                    uVar48 = (ulong)(0xf - ((uVar45 & 0x1ef) == 0));
                                    if ((uVar45 >> 0x14 & 1) != 0) {
                                      uVar48 = 0x10;
                                    }
                                    ppoVar40 = (p_t1->mqc).ctxs + uVar48;
                                    poVar8 = *ppoVar40;
                                    uVar22 = poVar8->qeval;
                                    uVar38 = uVar20 - uVar22;
                                    if ((uint)(uVar46 >> 0x10) < uVar22) {
                                      uVar4 = poVar8->mps;
                                      *ppoVar40 = (&poVar8->nmps)[uVar22 <= uVar38];
                                      uVar20 = uVar22;
                                      do {
                                        iVar42 = (int)uVar46;
                                        if (OVar53 == 0) {
                                          pOVar44 = (p_t1->mqc).bp;
                                          bVar19 = pOVar44[1];
                                          if (*pOVar44 == 0xff) {
                                            if (bVar19 < 0x90) {
                                              (p_t1->mqc).bp = pOVar44 + 1;
                                              iVar42 = iVar42 + (uint)bVar19 * 0x200;
                                              OVar53 = 7;
                                              goto LAB_0012e831;
                                            }
                                            iVar42 = iVar42 + 0xff00;
                                            pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                            *pOVar24 = *pOVar24 + 1;
                                          }
                                          else {
                                            (p_t1->mqc).bp = pOVar44 + 1;
                                            iVar42 = iVar42 + (uint)bVar19 * 0x100;
                                          }
                                          OVar53 = 8;
                                        }
LAB_0012e831:
                                        uVar20 = uVar20 * 2;
                                        uVar46 = (ulong)(uint)(iVar42 * 2);
                                        OVar53 = OVar53 - 1;
                                      } while (uVar20 < 0x8000);
                                      uVar21 = (uint)(uVar4 == 0);
                                      if (uVar38 < uVar22) {
                                        uVar21 = uVar4;
                                      }
                                    }
                                    else {
                                      uVar46 = (ulong)((int)uVar46 + uVar22 * -0x10000);
                                      uVar20 = uVar38;
                                      if ((short)uVar38 < 0) {
                                        uVar21 = poVar8->mps;
                                      }
                                      else {
                                        uVar4 = poVar8->mps;
                                        *ppoVar40 = (&poVar8->nmps)[uVar38 < uVar22];
                                        do {
                                          iVar42 = (int)uVar46;
                                          if (OVar53 == 0) {
                                            pOVar44 = (p_t1->mqc).bp;
                                            bVar19 = pOVar44[1];
                                            if (*pOVar44 == 0xff) {
                                              if (bVar19 < 0x90) {
                                                (p_t1->mqc).bp = pOVar44 + 1;
                                                iVar42 = iVar42 + (uint)bVar19 * 0x200;
                                                OVar53 = 7;
                                                goto LAB_0012e8b8;
                                              }
                                              iVar42 = iVar42 + 0xff00;
                                              pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                              *pOVar24 = *pOVar24 + 1;
                                            }
                                            else {
                                              (p_t1->mqc).bp = pOVar44 + 1;
                                              iVar42 = iVar42 + (uint)bVar19 * 0x100;
                                            }
                                            OVar53 = 8;
                                          }
LAB_0012e8b8:
                                          uVar20 = uVar20 * 2;
                                          uVar46 = (ulong)(uint)(iVar42 * 2);
                                          OVar53 = OVar53 - 1;
                                        } while (uVar20 < 0x8000);
                                        uVar21 = (uint)(uVar4 == 0);
                                        if (uVar22 <= uVar38) {
                                          uVar21 = uVar4;
                                        }
                                      }
                                    }
                                    uVar22 = uVar13;
                                    if (uVar21 == *puVar18 >> 0x1f) {
                                      uVar22 = uVar29;
                                    }
                                    *puVar18 = uVar22 + *puVar18;
                                    uVar45 = uVar45 | 0x100000;
                                  }
                                  if ((uVar45 & 0x1000080) == 0x80) {
                                    uVar48 = (ulong)(0xf - ((uVar45 & 0xf78) == 0));
                                    if ((uVar45 >> 0x17 & 1) != 0) {
                                      uVar48 = 0x10;
                                    }
                                    ppoVar40 = (p_t1->mqc).ctxs + uVar48;
                                    poVar8 = *ppoVar40;
                                    uVar22 = poVar8->qeval;
                                    uVar38 = uVar20 - uVar22;
                                    if ((uint)(uVar46 >> 0x10) < uVar22) {
                                      uVar4 = poVar8->mps;
                                      *ppoVar40 = (&poVar8->nmps)[uVar22 <= uVar38];
                                      uVar20 = uVar22;
                                      do {
                                        iVar42 = (int)uVar46;
                                        if (OVar53 == 0) {
                                          pOVar44 = (p_t1->mqc).bp;
                                          bVar19 = pOVar44[1];
                                          if (*pOVar44 == 0xff) {
                                            if (bVar19 < 0x90) {
                                              (p_t1->mqc).bp = pOVar44 + 1;
                                              iVar42 = iVar42 + (uint)bVar19 * 0x200;
                                              OVar53 = 7;
                                              goto LAB_0012e9c3;
                                            }
                                            iVar42 = iVar42 + 0xff00;
                                            pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                            *pOVar24 = *pOVar24 + 1;
                                          }
                                          else {
                                            (p_t1->mqc).bp = pOVar44 + 1;
                                            iVar42 = iVar42 + (uint)bVar19 * 0x100;
                                          }
                                          OVar53 = 8;
                                        }
LAB_0012e9c3:
                                        uVar20 = uVar20 * 2;
                                        uVar46 = (ulong)(uint)(iVar42 * 2);
                                        OVar53 = OVar53 - 1;
                                      } while (uVar20 < 0x8000);
                                      uVar21 = (uint)(uVar4 == 0);
                                      if (uVar38 < uVar22) {
                                        uVar21 = uVar4;
                                      }
                                    }
                                    else {
                                      uVar46 = (ulong)((int)uVar46 + uVar22 * -0x10000);
                                      uVar20 = uVar38;
                                      if ((short)uVar38 < 0) {
                                        uVar21 = poVar8->mps;
                                      }
                                      else {
                                        uVar4 = poVar8->mps;
                                        *ppoVar40 = (&poVar8->nmps)[uVar38 < uVar22];
                                        do {
                                          iVar42 = (int)uVar46;
                                          if (OVar53 == 0) {
                                            pOVar44 = (p_t1->mqc).bp;
                                            bVar19 = pOVar44[1];
                                            if (*pOVar44 == 0xff) {
                                              if (bVar19 < 0x90) {
                                                (p_t1->mqc).bp = pOVar44 + 1;
                                                iVar42 = iVar42 + (uint)bVar19 * 0x200;
                                                OVar53 = 7;
                                                goto LAB_0012ea4a;
                                              }
                                              iVar42 = iVar42 + 0xff00;
                                              pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                              *pOVar24 = *pOVar24 + 1;
                                            }
                                            else {
                                              (p_t1->mqc).bp = pOVar44 + 1;
                                              iVar42 = iVar42 + (uint)bVar19 * 0x100;
                                            }
                                            OVar53 = 8;
                                          }
LAB_0012ea4a:
                                          uVar20 = uVar20 * 2;
                                          uVar46 = (ulong)(uint)(iVar42 * 2);
                                          OVar53 = OVar53 - 1;
                                        } while (uVar20 < 0x8000);
                                        uVar21 = (uint)(uVar4 == 0);
                                        if (uVar22 <= uVar38) {
                                          uVar21 = uVar4;
                                        }
                                      }
                                    }
                                    uVar22 = uVar13;
                                    if (uVar21 == puVar18[uVar36] >> 0x1f) {
                                      uVar22 = uVar29;
                                    }
                                    puVar18[uVar36] = uVar22 + puVar18[uVar36];
                                    uVar45 = uVar45 | 0x800000;
                                  }
                                  if ((uVar45 & 0x8000400) == 0x400) {
                                    uVar48 = (ulong)(0xf - ((uVar45 & 0x7bc0) == 0));
                                    if ((uVar45 >> 0x1a & 1) != 0) {
                                      uVar48 = 0x10;
                                    }
                                    ppoVar40 = (p_t1->mqc).ctxs + uVar48;
                                    poVar8 = *ppoVar40;
                                    uVar22 = poVar8->qeval;
                                    uVar38 = uVar20 - uVar22;
                                    if ((uint)(uVar46 >> 0x10) < uVar22) {
                                      uVar4 = poVar8->mps;
                                      *ppoVar40 = (&poVar8->nmps)[uVar22 <= uVar38];
                                      uVar20 = uVar22;
                                      do {
                                        iVar42 = (int)uVar46;
                                        if (OVar53 == 0) {
                                          pOVar44 = (p_t1->mqc).bp;
                                          bVar19 = pOVar44[1];
                                          if (*pOVar44 == 0xff) {
                                            if (bVar19 < 0x90) {
                                              (p_t1->mqc).bp = pOVar44 + 1;
                                              iVar42 = iVar42 + (uint)bVar19 * 0x200;
                                              OVar53 = 7;
                                              goto LAB_0012eb57;
                                            }
                                            iVar42 = iVar42 + 0xff00;
                                            pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                            *pOVar24 = *pOVar24 + 1;
                                          }
                                          else {
                                            (p_t1->mqc).bp = pOVar44 + 1;
                                            iVar42 = iVar42 + (uint)bVar19 * 0x100;
                                          }
                                          OVar53 = 8;
                                        }
LAB_0012eb57:
                                        uVar20 = uVar20 * 2;
                                        uVar46 = (ulong)(uint)(iVar42 * 2);
                                        OVar53 = OVar53 - 1;
                                      } while (uVar20 < 0x8000);
                                      uVar21 = (uint)(uVar4 == 0);
                                      if (uVar38 < uVar22) {
                                        uVar21 = uVar4;
                                      }
                                    }
                                    else {
                                      uVar46 = (ulong)((int)uVar46 + uVar22 * -0x10000);
                                      uVar20 = uVar38;
                                      if ((short)uVar38 < 0) {
                                        uVar21 = poVar8->mps;
                                      }
                                      else {
                                        uVar4 = poVar8->mps;
                                        *ppoVar40 = (&poVar8->nmps)[uVar38 < uVar22];
                                        do {
                                          iVar42 = (int)uVar46;
                                          if (OVar53 == 0) {
                                            pOVar44 = (p_t1->mqc).bp;
                                            bVar19 = pOVar44[1];
                                            if (*pOVar44 == 0xff) {
                                              if (bVar19 < 0x90) {
                                                (p_t1->mqc).bp = pOVar44 + 1;
                                                iVar42 = iVar42 + (uint)bVar19 * 0x200;
                                                OVar53 = 7;
                                                goto LAB_0012ebde;
                                              }
                                              iVar42 = iVar42 + 0xff00;
                                              pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                              *pOVar24 = *pOVar24 + 1;
                                            }
                                            else {
                                              (p_t1->mqc).bp = pOVar44 + 1;
                                              iVar42 = iVar42 + (uint)bVar19 * 0x100;
                                            }
                                            OVar53 = 8;
                                          }
LAB_0012ebde:
                                          uVar20 = uVar20 * 2;
                                          uVar46 = (ulong)(uint)(iVar42 * 2);
                                          OVar53 = OVar53 - 1;
                                        } while (uVar20 < 0x8000);
                                        uVar21 = (uint)(uVar4 == 0);
                                        if (uVar22 <= uVar38) {
                                          uVar21 = uVar4;
                                        }
                                      }
                                    }
                                    uVar22 = uVar13;
                                    if (uVar21 == puVar18[uVar25 * 2] >> 0x1f) {
                                      uVar22 = uVar29;
                                    }
                                    puVar18[uVar25 * 2] = uVar22 + puVar18[uVar25 * 2];
                                    uVar45 = uVar45 | 0x4000000;
                                  }
                                  if ((uVar45 & 0x40002000) == 0x2000) {
                                    uVar48 = (ulong)(0xf - ((uVar45 & 0x3de00) == 0));
                                    if ((uVar45 >> 0x1d & 1) != 0) {
                                      uVar48 = 0x10;
                                    }
                                    ppoVar40 = (p_t1->mqc).ctxs + uVar48;
                                    poVar8 = *ppoVar40;
                                    uVar22 = poVar8->qeval;
                                    uVar38 = uVar20 - uVar22;
                                    if ((uint)(uVar46 >> 0x10) < uVar22) {
                                      uVar4 = poVar8->mps;
                                      *ppoVar40 = (&poVar8->nmps)[uVar22 <= uVar38];
                                      uVar20 = uVar22;
                                      do {
                                        iVar42 = (int)uVar46;
                                        if (OVar53 == 0) {
                                          pOVar44 = (p_t1->mqc).bp;
                                          bVar19 = pOVar44[1];
                                          if (*pOVar44 == 0xff) {
                                            if (bVar19 < 0x90) {
                                              (p_t1->mqc).bp = pOVar44 + 1;
                                              iVar42 = iVar42 + (uint)bVar19 * 0x200;
                                              OVar53 = 7;
                                              goto LAB_0012ecf5;
                                            }
                                            iVar42 = iVar42 + 0xff00;
                                            pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                            *pOVar24 = *pOVar24 + 1;
                                          }
                                          else {
                                            (p_t1->mqc).bp = pOVar44 + 1;
                                            iVar42 = iVar42 + (uint)bVar19 * 0x100;
                                          }
                                          OVar53 = 8;
                                        }
LAB_0012ecf5:
                                        uVar20 = uVar20 * 2;
                                        uVar46 = (ulong)(uint)(iVar42 * 2);
                                        OVar53 = OVar53 - 1;
                                      } while (uVar20 < 0x8000);
                                      uVar21 = (uint)(uVar4 == 0);
                                      if (uVar38 < uVar22) {
                                        uVar21 = uVar4;
                                      }
                                    }
                                    else {
                                      uVar46 = (ulong)((int)uVar46 + uVar22 * -0x10000);
                                      uVar20 = uVar38;
                                      if ((short)uVar38 < 0) {
                                        uVar21 = poVar8->mps;
                                      }
                                      else {
                                        uVar4 = poVar8->mps;
                                        *ppoVar40 = (&poVar8->nmps)[uVar38 < uVar22];
                                        do {
                                          iVar42 = (int)uVar46;
                                          if (OVar53 == 0) {
                                            pOVar44 = (p_t1->mqc).bp;
                                            bVar19 = pOVar44[1];
                                            if (*pOVar44 == 0xff) {
                                              if (bVar19 < 0x90) {
                                                (p_t1->mqc).bp = pOVar44 + 1;
                                                iVar42 = iVar42 + (uint)bVar19 * 0x200;
                                                OVar53 = 7;
                                                goto LAB_0012ed7c;
                                              }
                                              iVar42 = iVar42 + 0xff00;
                                              pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                              *pOVar24 = *pOVar24 + 1;
                                            }
                                            else {
                                              (p_t1->mqc).bp = pOVar44 + 1;
                                              iVar42 = iVar42 + (uint)bVar19 * 0x100;
                                            }
                                            OVar53 = 8;
                                          }
LAB_0012ed7c:
                                          uVar20 = uVar20 * 2;
                                          uVar46 = (ulong)(uint)(iVar42 * 2);
                                          OVar53 = OVar53 - 1;
                                        } while (uVar20 < 0x8000);
                                        uVar21 = (uint)(uVar4 == 0);
                                        if (uVar22 <= uVar38) {
                                          uVar21 = uVar4;
                                        }
                                      }
                                    }
                                    uVar22 = uVar13;
                                    if (uVar21 == puVar18[uVar39] >> 0x1f) {
                                      uVar22 = uVar29;
                                    }
                                    puVar18[uVar39] = uVar22 + puVar18[uVar39];
                                    uVar45 = uVar45 | 0x20000000;
                                  }
                                  *puVar37 = uVar45;
                                }
                                uVar50 = uVar50 + 1;
                                puVar18 = puVar18 + 1;
                                puVar37 = puVar37 + 1;
                              } while (uVar50 != uVar25);
                              uVar50 = p_t1->h;
                            }
                            uVar45 = (uint)uVar46;
                            uVar35 = uVar35 + 4;
                            puVar18 = puVar18 + uVar39;
                            puVar37 = puVar37 + 2;
                          } while (uVar35 < (uVar50 & 0xfffffffc));
                        }
                        (p_t1->mqc).curctx = ppoVar40;
                        (p_t1->mqc).c = uVar45;
                        (p_t1->mqc).a = uVar20;
                        (p_t1->mqc).ct = OVar53;
                        if ((uVar36 != 0) && (uVar35 < uVar50)) {
                          uVar20 = 0;
                          uVar45 = uVar50;
                          do {
                            bVar55 = uVar45 != uVar35;
                            uVar45 = uVar35;
                            if (bVar55) {
                              uVar39 = *puVar37;
                              uVar36 = 0;
                              do {
                                bVar19 = (char)uVar36 * '\x03';
                                if ((0x200010 << (bVar19 & 0x1f) & uVar39) ==
                                    0x10 << (bVar19 & 0x1f)) {
                                  uVar39 = uVar39 >> (bVar19 & 0x1f);
                                  iVar42 = 0xf - (uint)((uVar39 & 0x1ef) == 0);
                                  if ((uVar39 >> 0x14 & 1) != 0) {
                                    iVar42 = 0x10;
                                  }
                                  ppoVar40 = (opj_mqc_state_t **)
                                             ((long)(p_t1->mqc).ctxs + (ulong)(uint)(iVar42 << 3));
                                  (p_t1->mqc).curctx = ppoVar40;
                                  puVar17 = *(uint **)((long)(p_t1->mqc).ctxs +
                                                      (ulong)(uint)(iVar42 << 3));
                                  uVar50 = *puVar17;
                                  uVar45 = (p_t1->mqc).c;
                                  uVar39 = (p_t1->mqc).a - uVar50;
                                  (p_t1->mqc).a = uVar39;
                                  if (uVar45 >> 0x10 < uVar50) {
                                    uVar22 = puVar17[1];
                                    (p_t1->mqc).a = uVar50;
                                    *ppoVar40 = *(opj_mqc_state_t **)
                                                 (puVar17 + (ulong)(uVar50 <= uVar39) * 2 + 2);
                                    OVar53 = (p_t1->mqc).ct;
                                    uVar29 = uVar50;
                                    do {
                                      if (OVar53 == 0) {
                                        pOVar44 = (p_t1->mqc).bp;
                                        bVar1 = pOVar44[1];
                                        if (*pOVar44 == 0xff) {
                                          if (bVar1 < 0x90) {
                                            (p_t1->mqc).bp = pOVar44 + 1;
                                            uVar45 = uVar45 + (uint)bVar1 * 0x200;
                                            OVar53 = 7;
                                            goto LAB_0012ef53;
                                          }
                                          uVar45 = uVar45 + 0xff00;
                                          pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                          *pOVar24 = *pOVar24 + 1;
                                        }
                                        else {
                                          (p_t1->mqc).bp = pOVar44 + 1;
                                          uVar45 = uVar45 + (uint)bVar1 * 0x100;
                                        }
                                        OVar53 = 8;
                                      }
LAB_0012ef53:
                                      uVar29 = uVar29 * 2;
                                      (p_t1->mqc).a = uVar29;
                                      uVar45 = uVar45 * 2;
                                      (p_t1->mqc).c = uVar45;
                                      OVar53 = OVar53 - 1;
                                      (p_t1->mqc).ct = OVar53;
                                    } while (uVar29 < 0x8000);
                                    uVar29 = (uint)(uVar22 == 0);
                                    if (uVar39 < uVar50) {
                                      uVar29 = uVar22;
                                    }
                                  }
                                  else {
                                    OVar53 = uVar45 + uVar50 * -0x10000;
                                    (p_t1->mqc).c = OVar53;
                                    if ((short)uVar39 < 0) {
                                      uVar29 = puVar17[1];
                                    }
                                    else {
                                      uVar45 = puVar17[1];
                                      *ppoVar40 = *(opj_mqc_state_t **)
                                                   (puVar17 + (ulong)(uVar39 < uVar50) * 2 + 2);
                                      OVar52 = (p_t1->mqc).ct;
                                      uVar29 = uVar39;
                                      do {
                                        if (OVar52 == 0) {
                                          pOVar44 = (p_t1->mqc).bp;
                                          bVar1 = pOVar44[1];
                                          if (*pOVar44 == 0xff) {
                                            if (bVar1 < 0x90) {
                                              (p_t1->mqc).bp = pOVar44 + 1;
                                              OVar53 = OVar53 + (uint)bVar1 * 0x200;
                                              OVar52 = 7;
                                              goto LAB_0012eff2;
                                            }
                                            OVar53 = OVar53 + 0xff00;
                                            pOVar24 = &(p_t1->mqc).end_of_byte_stream_counter;
                                            *pOVar24 = *pOVar24 + 1;
                                          }
                                          else {
                                            (p_t1->mqc).bp = pOVar44 + 1;
                                            OVar53 = OVar53 + (uint)bVar1 * 0x100;
                                          }
                                          OVar52 = 8;
                                        }
LAB_0012eff2:
                                        uVar29 = uVar29 * 2;
                                        (p_t1->mqc).a = uVar29;
                                        OVar53 = OVar53 * 2;
                                        (p_t1->mqc).c = OVar53;
                                        OVar52 = OVar52 - 1;
                                        (p_t1->mqc).ct = OVar52;
                                      } while (uVar29 < 0x8000);
                                      uVar29 = (uint)(uVar45 == 0);
                                      if (uVar50 <= uVar39) {
                                        uVar29 = uVar45;
                                      }
                                    }
                                  }
                                  uVar45 = uVar25 * (int)uVar36;
                                  uVar50 = uVar13;
                                  if (uVar29 == puVar18[uVar45] >> 0x1f) {
                                    uVar50 = -uVar13;
                                  }
                                  puVar18[uVar45] = uVar50 + puVar18[uVar45];
                                  uVar39 = 0x100000 << (bVar19 & 0x1f) | *puVar37;
                                  *puVar37 = uVar39;
                                  uVar50 = p_t1->h;
                                }
                                uVar36 = uVar36 + 1;
                                uVar45 = uVar50;
                              } while (uVar36 < uVar50 - uVar35);
                            }
                            uVar20 = uVar20 + 1;
                            puVar18 = puVar18 + 1;
                            puVar37 = puVar37 + 1;
                          } while (uVar20 != uVar25);
                        }
                      }
                    }
                    else {
                      puVar18 = (uint *)p_t1->data;
                      uVar25 = p_t1->w;
                      uVar36 = (ulong)uVar25;
                      puVar37 = p_t1->flags + (uVar25 + 3);
                      uVar45 = (uint)(1 << (bVar19 & 0x1f)) >> 1;
                      uVar50 = p_t1->h;
                      uVar20 = 0;
                      if (3 < uVar50) {
                        uVar13 = -uVar45;
                        uVar35 = uVar25 * 3;
                        uVar20 = 0;
                        do {
                          uVar46 = uVar36;
                          if (uVar25 != 0) {
                            do {
                              uVar50 = *puVar37;
                              if (uVar50 != 0) {
                                if ((uVar50 & 0x200010) == 0x10) {
                                  uVar50 = (p_t1->mqc).c;
                                  OVar53 = (p_t1->mqc).ct;
                                  if (OVar53 == 0) {
                                    pbVar9 = (p_t1->mqc).bp;
                                    bVar55 = uVar50 == 0xff;
                                    uVar50 = (uint)*pbVar9;
                                    if (bVar55) {
                                      if (*pbVar9 < 0x90) {
                                        (p_t1->mqc).c = uVar50;
                                        (p_t1->mqc).bp = pbVar9 + 1;
                                        OVar53 = 7;
                                      }
                                      else {
                                        (p_t1->mqc).c = 0xff;
                                        OVar53 = 8;
                                        uVar50 = 0xff;
                                      }
                                    }
                                    else {
                                      (p_t1->mqc).c = uVar50;
                                      (p_t1->mqc).bp = pbVar9 + 1;
                                      OVar53 = 8;
                                    }
                                  }
                                  (p_t1->mqc).ct = OVar53 - 1;
                                  uVar39 = uVar13;
                                  if ((uint)((uVar50 >> (OVar53 - 1 & 0x1f) & 1) != 0) !=
                                      *puVar18 >> 0x1f) {
                                    uVar39 = uVar45;
                                  }
                                  *puVar18 = uVar39 + *puVar18;
                                  uVar50 = *puVar37 | 0x100000;
                                  *puVar37 = uVar50;
                                }
                                if ((uVar50 & 0x1000080) == 0x80) {
                                  uVar50 = (p_t1->mqc).c;
                                  OVar53 = (p_t1->mqc).ct;
                                  if (OVar53 == 0) {
                                    pbVar9 = (p_t1->mqc).bp;
                                    bVar55 = uVar50 == 0xff;
                                    uVar50 = (uint)*pbVar9;
                                    if (bVar55) {
                                      if (*pbVar9 < 0x90) {
                                        (p_t1->mqc).c = uVar50;
                                        (p_t1->mqc).bp = pbVar9 + 1;
                                        OVar53 = 7;
                                      }
                                      else {
                                        (p_t1->mqc).c = 0xff;
                                        OVar53 = 8;
                                        uVar50 = 0xff;
                                      }
                                    }
                                    else {
                                      (p_t1->mqc).c = uVar50;
                                      (p_t1->mqc).bp = pbVar9 + 1;
                                      OVar53 = 8;
                                    }
                                  }
                                  (p_t1->mqc).ct = OVar53 - 1;
                                  uVar39 = uVar13;
                                  if ((uint)((uVar50 >> (OVar53 - 1 & 0x1f) & 1) != 0) !=
                                      puVar18[uVar36] >> 0x1f) {
                                    uVar39 = uVar45;
                                  }
                                  puVar18[uVar36] = uVar39 + puVar18[uVar36];
                                  uVar50 = *puVar37 | 0x800000;
                                  *puVar37 = uVar50;
                                }
                                if ((uVar50 & 0x8000400) == 0x400) {
                                  uVar50 = (p_t1->mqc).c;
                                  OVar53 = (p_t1->mqc).ct;
                                  if (OVar53 == 0) {
                                    pbVar9 = (p_t1->mqc).bp;
                                    bVar55 = uVar50 == 0xff;
                                    uVar50 = (uint)*pbVar9;
                                    if (bVar55) {
                                      if (*pbVar9 < 0x90) {
                                        (p_t1->mqc).c = uVar50;
                                        (p_t1->mqc).bp = pbVar9 + 1;
                                        OVar53 = 7;
                                      }
                                      else {
                                        (p_t1->mqc).c = 0xff;
                                        OVar53 = 8;
                                        uVar50 = 0xff;
                                      }
                                    }
                                    else {
                                      (p_t1->mqc).c = uVar50;
                                      (p_t1->mqc).bp = pbVar9 + 1;
                                      OVar53 = 8;
                                    }
                                  }
                                  (p_t1->mqc).ct = OVar53 - 1;
                                  uVar39 = uVar13;
                                  if ((uint)((uVar50 >> (OVar53 - 1 & 0x1f) & 1) != 0) !=
                                      puVar18[uVar25 * 2] >> 0x1f) {
                                    uVar39 = uVar45;
                                  }
                                  puVar18[uVar25 * 2] = uVar39 + puVar18[uVar25 * 2];
                                  uVar50 = *puVar37 | 0x4000000;
                                  *puVar37 = uVar50;
                                }
                                if ((uVar50 & 0x40002000) == 0x2000) {
                                  uVar50 = (p_t1->mqc).c;
                                  OVar53 = (p_t1->mqc).ct;
                                  if (OVar53 == 0) {
                                    pbVar9 = (p_t1->mqc).bp;
                                    bVar55 = uVar50 == 0xff;
                                    uVar50 = (uint)*pbVar9;
                                    if (bVar55) {
                                      if (*pbVar9 < 0x90) {
                                        (p_t1->mqc).c = uVar50;
                                        (p_t1->mqc).bp = pbVar9 + 1;
                                        OVar53 = 7;
                                      }
                                      else {
                                        (p_t1->mqc).c = 0xff;
                                        OVar53 = 8;
                                        uVar50 = 0xff;
                                      }
                                    }
                                    else {
                                      (p_t1->mqc).c = uVar50;
                                      (p_t1->mqc).bp = pbVar9 + 1;
                                      OVar53 = 8;
                                    }
                                  }
                                  (p_t1->mqc).ct = OVar53 - 1;
                                  uVar39 = uVar13;
                                  if ((uint)((uVar50 >> (OVar53 - 1 & 0x1f) & 1) != 0) !=
                                      puVar18[uVar35] >> 0x1f) {
                                    uVar39 = uVar45;
                                  }
                                  puVar18[uVar35] = uVar39 + puVar18[uVar35];
                                  *(byte *)((long)puVar37 + 3) = *(byte *)((long)puVar37 + 3) | 0x20
                                  ;
                                }
                              }
                              puVar37 = puVar37 + 1;
                              puVar18 = puVar18 + 1;
                              uVar50 = (int)uVar46 - 1;
                              uVar46 = (ulong)uVar50;
                            } while (uVar50 != 0);
                            uVar50 = p_t1->h;
                          }
                          uVar20 = uVar20 + 4;
                          puVar37 = puVar37 + 2;
                          puVar18 = puVar18 + uVar35;
                        } while (uVar20 < (uVar50 & 0xfffffffc));
                      }
                      if (uVar25 != 0 && uVar20 < uVar50) {
                        uVar13 = 0;
                        uVar35 = uVar50;
                        do {
                          bVar55 = uVar35 != uVar20;
                          uVar35 = uVar20;
                          if (bVar55) {
                            uVar39 = *puVar37;
                            uVar36 = 0;
                            bVar19 = 0;
                            uVar46 = 0;
                            do {
                              if ((0x200010 << (bVar19 & 0x1f) & uVar39) == 0x10 << (bVar19 & 0x1f))
                              {
                                uVar50 = (p_t1->mqc).c;
                                OVar53 = (p_t1->mqc).ct;
                                if (OVar53 == 0) {
                                  pbVar9 = (p_t1->mqc).bp;
                                  bVar55 = uVar50 == 0xff;
                                  uVar50 = (uint)*pbVar9;
                                  if (bVar55) {
                                    if (*pbVar9 < 0x90) {
                                      (p_t1->mqc).c = uVar50;
                                      (p_t1->mqc).bp = pbVar9 + 1;
                                      OVar53 = 7;
                                    }
                                    else {
                                      (p_t1->mqc).c = 0xff;
                                      OVar53 = 8;
                                      uVar50 = 0xff;
                                    }
                                  }
                                  else {
                                    (p_t1->mqc).c = uVar50;
                                    (p_t1->mqc).bp = pbVar9 + 1;
                                    OVar53 = 8;
                                  }
                                }
                                (p_t1->mqc).ct = OVar53 - 1;
                                uVar35 = -uVar45;
                                if ((uint)((uVar50 >> (OVar53 - 1 & 0x1f) & 1) != 0) !=
                                    puVar18[uVar36] >> 0x1f) {
                                  uVar35 = uVar45;
                                }
                                puVar18[uVar36] = uVar35 + puVar18[uVar36];
                                uVar39 = 0x100000 << (bVar19 & 0x1f) | *puVar37;
                                *puVar37 = uVar39;
                                uVar50 = p_t1->h;
                              }
                              uVar46 = uVar46 + 1;
                              bVar19 = bVar19 + 3;
                              uVar36 = (ulong)((int)uVar36 + uVar25);
                              uVar35 = uVar50;
                            } while (uVar46 < uVar50 - uVar20);
                          }
                          uVar13 = uVar13 + 1;
                          puVar37 = puVar37 + 1;
                          puVar18 = puVar18 + 1;
                        } while (uVar13 != uVar25);
                      }
                    }
                  }
                  else if ((bVar54 || bVar56) || bVar10) {
                    opj_t1_dec_sigpass_mqc(p_t1,uVar49,uVar34);
                  }
                  else {
                    pOVar47 = p_t1->data;
                    uVar25 = p_t1->w;
                    flagsp_00 = p_t1->flags + (uVar25 + 3);
                    uVar20 = (uint)(1 << (bVar19 & 0x1f)) >> 1 | 1 << (uVar49 & 0x1f);
                    uVar50 = p_t1->h;
                    uVar45 = 0;
                    if (3 < uVar50) {
                      uVar45 = 0;
                      do {
                        if (uVar25 != 0) {
                          lVar23 = 0;
                          uVar50 = uVar25;
                          do {
                            if (*(int *)((long)flagsp_00 + lVar23) != 0) {
                              flagsp = (opj_flag_t *)((long)flagsp_00 + lVar23);
                              opj_t1_dec_sigpass_step_raw
                                        (p_t1,flagsp,(OPJ_INT32 *)((long)pOVar47 + lVar23),uVar20,
                                         uVar34 & 8,0);
                              uVar35 = *flagsp;
                              if ((uVar35 & 0xf78) != 0 && (uVar35 & 0x1000080) == 0) {
                                uVar35 = (p_t1->mqc).c;
                                OVar53 = (p_t1->mqc).ct;
                                if (OVar53 == 0) {
                                  pbVar9 = (p_t1->mqc).bp;
                                  bVar55 = uVar35 == 0xff;
                                  uVar35 = (uint)*pbVar9;
                                  if (bVar55) {
                                    if (*pbVar9 < 0x90) {
                                      (p_t1->mqc).c = uVar35;
                                      (p_t1->mqc).bp = pbVar9 + 1;
                                      OVar53 = 7;
                                    }
                                    else {
                                      (p_t1->mqc).c = 0xff;
                                      OVar53 = 8;
                                      uVar35 = 0xff;
                                    }
                                  }
                                  else {
                                    (p_t1->mqc).c = uVar35;
                                    (p_t1->mqc).bp = pbVar9 + 1;
                                    OVar53 = 8;
                                  }
                                }
                                uVar13 = OVar53 - 1;
                                (p_t1->mqc).ct = uVar13;
                                if ((uVar35 >> (uVar13 & 0x1f) & 1) == 0) {
                                  oVar26 = *flagsp;
                                }
                                else {
                                  if (uVar13 == 0) {
                                    pbVar9 = (p_t1->mqc).bp;
                                    bVar55 = uVar35 == 0xff;
                                    uVar35 = (uint)*pbVar9;
                                    if (bVar55) {
                                      if (*pbVar9 < 0x90) {
                                        (p_t1->mqc).c = uVar35;
                                        (p_t1->mqc).bp = pbVar9 + 1;
                                        uVar13 = 7;
                                      }
                                      else {
                                        (p_t1->mqc).c = 0xff;
                                        uVar13 = 8;
                                        uVar35 = 0xff;
                                      }
                                    }
                                    else {
                                      (p_t1->mqc).c = uVar35;
                                      (p_t1->mqc).bp = pbVar9 + 1;
                                      uVar13 = 8;
                                    }
                                  }
                                  (p_t1->mqc).ct = uVar13 - 1;
                                  bVar55 = (uVar35 >> (uVar13 - 1 & 0x1f) & 1) != 0;
                                  uVar35 = -uVar20;
                                  if (!bVar55) {
                                    uVar35 = uVar20;
                                  }
                                  *(uint *)((long)pOVar47 + lVar23 + (ulong)uVar25 * 4) = uVar35;
                                  pbVar9 = (byte *)((long)flagsp_00 + lVar23 + -3);
                                  *pbVar9 = *pbVar9 | 1;
                                  oVar26 = (uint)bVar55 << 0x16 |
                                           *(uint *)((long)flagsp_00 + lVar23) | 0x80;
                                  pbVar9 = (byte *)((long)flagsp_00 + lVar23 + 4);
                                  *pbVar9 = *pbVar9 | 0x40;
                                }
                                uVar35 = oVar26 | 0x1000000;
                                *flagsp = uVar35;
                              }
                              if ((uVar35 & 0x7bc0) != 0 && (uVar35 & 0x8000400) == 0) {
                                uVar35 = (p_t1->mqc).c;
                                OVar53 = (p_t1->mqc).ct;
                                if (OVar53 == 0) {
                                  pbVar9 = (p_t1->mqc).bp;
                                  bVar55 = uVar35 == 0xff;
                                  uVar35 = (uint)*pbVar9;
                                  if (bVar55) {
                                    if (*pbVar9 < 0x90) {
                                      (p_t1->mqc).c = uVar35;
                                      (p_t1->mqc).bp = pbVar9 + 1;
                                      OVar53 = 7;
                                    }
                                    else {
                                      (p_t1->mqc).c = 0xff;
                                      OVar53 = 8;
                                      uVar35 = 0xff;
                                    }
                                  }
                                  else {
                                    (p_t1->mqc).c = uVar35;
                                    (p_t1->mqc).bp = pbVar9 + 1;
                                    OVar53 = 8;
                                  }
                                }
                                uVar13 = OVar53 - 1;
                                (p_t1->mqc).ct = uVar13;
                                if ((uVar35 >> (uVar13 & 0x1f) & 1) == 0) {
                                  oVar26 = *flagsp;
                                }
                                else {
                                  if (uVar13 == 0) {
                                    pbVar9 = (p_t1->mqc).bp;
                                    bVar55 = uVar35 == 0xff;
                                    uVar35 = (uint)*pbVar9;
                                    if (bVar55) {
                                      if (*pbVar9 < 0x90) {
                                        (p_t1->mqc).c = uVar35;
                                        (p_t1->mqc).bp = pbVar9 + 1;
                                        uVar13 = 7;
                                      }
                                      else {
                                        (p_t1->mqc).c = 0xff;
                                        uVar13 = 8;
                                        uVar35 = 0xff;
                                      }
                                    }
                                    else {
                                      (p_t1->mqc).c = uVar35;
                                      (p_t1->mqc).bp = pbVar9 + 1;
                                      uVar13 = 8;
                                    }
                                  }
                                  (p_t1->mqc).ct = uVar13 - 1;
                                  bVar55 = (uVar35 >> (uVar13 - 1 & 0x1f) & 1) != 0;
                                  uVar35 = -uVar20;
                                  if (!bVar55) {
                                    uVar35 = uVar20;
                                  }
                                  *(uint *)((long)pOVar47 + lVar23 + (ulong)(uVar25 * 2) * 4) =
                                       uVar35;
                                  pbVar9 = (byte *)((long)flagsp_00 + lVar23 + -3);
                                  *pbVar9 = *pbVar9 | 8;
                                  oVar26 = (uint)bVar55 << 0x19 |
                                           *(uint *)((long)flagsp_00 + lVar23) | 0x400;
                                  pbVar9 = (byte *)((long)flagsp_00 + lVar23 + 5);
                                  *pbVar9 = *pbVar9 | 2;
                                }
                                *flagsp = oVar26 | 0x8000000;
                              }
                              opj_t1_dec_sigpass_step_raw
                                        (p_t1,flagsp,
                                         (OPJ_INT32 *)
                                         ((long)pOVar47 + lVar23 + (ulong)(uVar25 * 3) * 4),uVar20,0
                                         ,3);
                            }
                            lVar23 = lVar23 + 4;
                            uVar50 = uVar50 - 1;
                          } while (uVar50 != 0);
                          uVar50 = p_t1->h;
                          flagsp_00 = (opj_flag_t *)((long)flagsp_00 + lVar23);
                          pOVar47 = (OPJ_INT32 *)((long)pOVar47 + lVar23);
                        }
                        uVar45 = uVar45 + 4;
                        flagsp_00 = flagsp_00 + 2;
                        pOVar47 = pOVar47 + uVar25 * 3;
                      } while (uVar45 < (uVar50 & 0xfffffffc));
                    }
                    if (uVar25 != 0 && uVar45 < uVar50) {
                      uVar35 = 0;
                      do {
                        bVar55 = uVar50 != uVar45;
                        uVar50 = uVar45;
                        if (bVar55) {
                          uVar36 = 0;
                          uVar46 = 0;
                          do {
                            opj_t1_dec_sigpass_step_raw
                                      (p_t1,flagsp_00,pOVar47 + uVar36,uVar20,uVar34 & 8,
                                       (OPJ_UINT32)uVar46);
                            uVar46 = uVar46 + 1;
                            uVar50 = p_t1->h;
                            uVar36 = (ulong)((int)uVar36 + uVar25);
                          } while (uVar46 < uVar50 - uVar45);
                        }
                        uVar35 = uVar35 + 1;
                        flagsp_00 = flagsp_00 + 1;
                        pOVar47 = pOVar47 + 1;
                      } while (uVar35 != uVar25);
                    }
                  }
                }
                if (((byte)uVar34 >> 1 & ((bVar54 || bVar56) || bVar10)) != 0) {
                  opj_mqc_resetstates(&p_t1->mqc);
                  opj_mqc_setstate(&p_t1->mqc,0x12,0,0x2e);
                  opj_mqc_setstate(&p_t1->mqc,0x11,0,3);
                  opj_mqc_setstate(&p_t1->mqc,0,0,4);
                }
                uVar25 = uVar31 + 1;
                uVar31 = uVar25;
                if (uVar25 == 3) {
                  uVar31 = 0;
                }
                uVar49 = uVar49 - (uVar25 == 3);
                uVar30 = uVar30 + 1;
              } while ((uVar30 < poVar7->real_num_passes) && (0 < (int)uVar49));
            }
            opq_mqc_finish_dec(&p_t1->mqc);
            uVar27 = uVar27 + 1;
          } while (uVar27 < cblk->real_num_segs);
        }
        if (OVar12 != 0) {
          pOVar14 = (p_t1->mqc).bp;
          pOVar44 = (p_t1->mqc).end;
          if (pOVar14 + 2 < pOVar44) {
            if (p_manager_mutex != (opj_mutex_t *)0x0) {
              opj_mutex_lock(p_manager_mutex);
              pOVar14 = (p_t1->mqc).bp;
              pOVar44 = (p_t1->mqc).end;
            }
            iVar42 = *(int *)&(p_t1->mqc).start;
            opj_event_msg(p_manager,2,
                          "PTERM check failure: %d remaining bytes in code block (%d used / %d)\n",
                          (ulong)(((int)pOVar44 - (int)pOVar14) - 2),
                          (ulong)(uint)((int)pOVar14 - iVar42),(ulong)(uint)((int)pOVar44 - iVar42))
            ;
            if (p_manager_mutex != (opj_mutex_t *)0x0) {
LAB_0012f5f8:
              opj_mutex_unlock(p_manager_mutex);
            }
          }
          else if (2 < (p_t1->mqc).end_of_byte_stream_counter) {
            if (p_manager_mutex != (opj_mutex_t *)0x0) {
              opj_mutex_lock(p_manager_mutex);
              opj_event_msg(p_manager,2,"PTERM check failure: %d synthetized 0xFF markers read\n",
                            (ulong)(p_t1->mqc).end_of_byte_stream_counter);
              goto LAB_0012f5f8;
            }
            opj_event_msg(p_manager,2,"PTERM check failure: %d synthetized 0xFF markers read\n");
          }
        }
        if (cblk->decoded_data != (OPJ_INT32 *)0x0) {
          p_t1->data = local_88;
        }
        goto LAB_0012d4a0;
      }
      if (p_manager_mutex == (opj_mutex_t *)0x0) {
        opj_event_msg(p_manager,2,"opj_t1_decode_cblk(): unsupported bpno_plus_one = %d >= 31\n",
                      (ulong)uVar49);
      }
      else {
        opj_mutex_lock(p_manager_mutex);
        opj_event_msg(p_manager,2,"opj_t1_decode_cblk(): unsupported bpno_plus_one = %d >= 31\n",
                      (ulong)uVar49);
        opj_mutex_unlock(p_manager_mutex);
      }
    }
LAB_0012da33:
    **(undefined4 **)((long)user_data + 0x30) = 0;
  }
  else {
    OVar12 = opj_t1_ht_decode_cblk
                       (p_t1,cblk,piVar5[4],OVar53,uVar34,p_manager,p_manager_mutex,OVar12);
    if (OVar12 == 0) goto LAB_0012da33;
LAB_0012d4a0:
    iVar42 = cblk->x0 - *piVar5;
    if ((piVar5[4] & 1U) != 0) {
      lVar23 = (ulong)(iVar2 - 1) * 0xc0;
      iVar42 = (iVar42 + *(int *)(*(long *)(lVar16 + 0x20) + 8 + lVar23)) -
               *(int *)(*(long *)(lVar16 + 0x20) + lVar23);
    }
    iVar41 = cblk->y0 - piVar5[1];
    if ((piVar5[4] & 2U) != 0) {
      lVar23 = (ulong)(iVar2 - 1) * 0xc0;
      iVar41 = (iVar41 + *(int *)(*(long *)(lVar16 + 0x20) + 0xc + lVar23)) -
               *(int *)(*(long *)(lVar16 + 0x20) + 4 + lVar23);
    }
    pfVar6 = (float *)cblk->decoded_data;
    pfVar28 = pfVar6;
    if (pfVar6 == (float *)0x0) {
      pfVar28 = (float *)p_t1->data;
    }
    uVar34 = p_t1->w;
    uVar27 = (ulong)uVar34;
    uVar49 = p_t1->h;
    uVar36 = (ulong)uVar49;
    iVar2 = *(int *)(lVar43 + 0x328);
    if (iVar2 != 0) {
      if (iVar2 < 0x1f) {
        if (uVar36 != 0) {
          uVar31 = 0;
          uVar25 = 0;
          uVar46 = uVar27;
          uVar30 = uVar31;
          do {
            for (; uVar46 != 0; uVar46 = uVar46 - 1) {
              fVar57 = pfVar28[uVar31];
              fVar32 = (float)-(int)fVar57;
              if (0 < (int)fVar57) {
                fVar32 = fVar57;
              }
              if ((uint)fVar32 >> ((byte)iVar2 & 0x1f) != 0) {
                fVar32 = (float)((uint)fVar32 >> (*(byte *)(lVar43 + 0x328) & 0x1f));
                fVar3 = (float)-(int)fVar32;
                if (-1 < (int)fVar57) {
                  fVar3 = fVar32;
                }
                pfVar28[uVar31] = fVar3;
              }
              uVar31 = uVar31 + 1;
            }
            uVar25 = uVar25 + 1;
            uVar31 = uVar30 + uVar34;
            uVar46 = uVar27;
            uVar30 = uVar31;
          } while (uVar25 != uVar49);
        }
      }
      else if (uVar36 != 0) {
        uVar31 = 0;
        uVar25 = 0;
        uVar46 = uVar27;
        uVar30 = uVar31;
        do {
          for (; uVar46 != 0; uVar46 = uVar46 - 1) {
            pfVar28[uVar31] = 0.0;
            uVar31 = uVar31 + 1;
          }
          uVar25 = uVar25 + 1;
          uVar31 = uVar30 + uVar34;
          uVar46 = uVar27;
          uVar30 = uVar31;
        } while (uVar25 != uVar49);
      }
    }
    if (pfVar6 == (float *)0x0) {
      lVar16 = *(long *)(lVar16 + 0x30);
      if (lVar16 == 0) {
        __assert_fail("(cblk->decoded_data != NULL) || (tilec->data != NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/t1.c"
                      ,0x6de,"void opj_t1_clbl_decode_processor(void *, opj_tls_t *)");
      }
      if (*(int *)(lVar43 + 0x14) == 1) {
        if (uVar36 != 0) {
          lVar16 = lVar16 + (long)iVar41 * (ulong)uVar33 * 4 + (long)iVar42 * 4;
          lVar43 = 0;
          uVar46 = 0;
          do {
            uVar48 = 0;
            iVar2 = (int)lVar43;
            if ((uVar34 & 0xfffffffc) != 0) {
              uVar48 = 0;
              do {
                iVar42 = (int)uVar48;
                fVar57 = pfVar28[(uint)(iVar2 + 3 + iVar42)];
                fVar32 = pfVar28[(uint)(iVar2 + 2 + iVar42)];
                fVar3 = pfVar28[iVar2 + iVar42 + 1];
                piVar5 = (int *)(lVar16 + uVar48 * 4);
                *piVar5 = (int)pfVar28[(uint)(iVar2 + iVar42)] / 2;
                piVar5[1] = (int)fVar3 / 2;
                piVar5[2] = (int)fVar32 / 2;
                piVar5[3] = (int)fVar57 / 2;
                uVar48 = uVar48 + 4;
              } while (uVar48 < (uVar34 & 0xfffffffc));
            }
            if ((uint)uVar48 < uVar34) {
              uVar48 = uVar48 & 0xffffffff;
              do {
                *(int *)(lVar16 + uVar48 * 4) = (int)pfVar28[(uint)(iVar2 + (int)uVar48)] / 2;
                uVar48 = uVar48 + 1;
              } while (uVar27 != uVar48);
            }
            uVar46 = uVar46 + 1;
            lVar16 = lVar16 + (ulong)uVar33 * 4;
            lVar43 = lVar43 + uVar27;
          } while (uVar46 != uVar36);
        }
      }
      else if (uVar36 != 0) {
        fVar57 = (float)piVar5[10];
        lVar16 = lVar16 + (long)iVar41 * (ulong)uVar33 * 4 + (long)iVar42 * 4;
        uVar31 = 0;
        do {
          if (uVar27 != 0) {
            lVar43 = 0;
            do {
              *(float *)(lVar16 + lVar43 * 4) = (float)(int)*pfVar28 * fVar57 * 0.5;
              pfVar28 = pfVar28 + 1;
              lVar43 = lVar43 + 1;
            } while (uVar34 != (uint)lVar43);
          }
          uVar31 = uVar31 + 1;
          lVar16 = lVar16 + (ulong)uVar33 * 4;
        } while (uVar31 != uVar49);
      }
    }
    else {
      uVar34 = uVar34 * uVar49;
      if (*(int *)(lVar43 + 0x14) == 1) {
        if (uVar34 != 0) {
          uVar27 = 0;
          do {
            pfVar28[uVar27] = (float)((int)pfVar28[uVar27] / 2);
            uVar27 = uVar27 + 1;
          } while (uVar34 != uVar27);
        }
      }
      else {
        fVar57 = (float)piVar5[10] * 0.5;
        uVar33 = uVar34 & 0xfffffff0;
        if (uVar33 == 0) {
          uVar33 = 0;
        }
        else {
          uVar49 = 0;
          do {
            *pfVar28 = (float)(int)*pfVar28 * fVar57;
            pfVar28[1] = (float)(int)pfVar28[1] * fVar57;
            pfVar28[2] = (float)(int)pfVar28[2] * fVar57;
            pfVar28[3] = (float)(int)pfVar28[3] * fVar57;
            pfVar28[4] = (float)(int)pfVar28[4] * fVar57;
            pfVar28[5] = (float)(int)pfVar28[5] * fVar57;
            pfVar28[6] = (float)(int)pfVar28[6] * fVar57;
            pfVar28[7] = (float)(int)pfVar28[7] * fVar57;
            pfVar28[8] = (float)(int)pfVar28[8] * fVar57;
            pfVar28[9] = (float)(int)pfVar28[9] * fVar57;
            pfVar28[10] = (float)(int)pfVar28[10] * fVar57;
            pfVar28[0xb] = (float)(int)pfVar28[0xb] * fVar57;
            pfVar28[0xc] = (float)(int)pfVar28[0xc] * fVar57;
            pfVar28[0xd] = (float)(int)pfVar28[0xd] * fVar57;
            pfVar28[0xe] = (float)(int)pfVar28[0xe] * fVar57;
            pfVar28[0xf] = (float)(int)pfVar28[0xf] * fVar57;
            pfVar28 = pfVar28 + 0x10;
            uVar49 = uVar49 + 0x10;
          } while (uVar49 < uVar33);
        }
        if (uVar33 <= uVar34 && uVar34 - uVar33 != 0) {
          lVar16 = 0;
          do {
            pfVar28[lVar16] = (float)(int)pfVar28[lVar16] * fVar57;
            lVar16 = lVar16 + 1;
          } while (uVar34 - uVar33 != (int)lVar16);
        }
      }
    }
  }
LAB_0012da41:
  opj_free(user_data);
  return;
}

Assistant:

static void opj_t1_clbl_decode_processor(void* user_data, opj_tls_t* tls)
{
    opj_tcd_cblk_dec_t* cblk;
    opj_tcd_band_t* band;
    opj_tcd_tilecomp_t* tilec;
    opj_tccp_t* tccp;
    OPJ_INT32* OPJ_RESTRICT datap;
    OPJ_UINT32 cblk_w, cblk_h;
    OPJ_INT32 x, y;
    OPJ_UINT32 i, j;
    opj_t1_cblk_decode_processing_job_t* job;
    opj_t1_t* t1;
    OPJ_UINT32 resno;
    OPJ_UINT32 tile_w;

    job = (opj_t1_cblk_decode_processing_job_t*) user_data;

    cblk = job->cblk;

    if (!job->whole_tile_decoding) {
        cblk_w = (OPJ_UINT32)(cblk->x1 - cblk->x0);
        cblk_h = (OPJ_UINT32)(cblk->y1 - cblk->y0);

        cblk->decoded_data = (OPJ_INT32*)opj_aligned_malloc(sizeof(OPJ_INT32) *
                             cblk_w * cblk_h);
        if (cblk->decoded_data == NULL) {
            if (job->p_manager_mutex) {
                opj_mutex_lock(job->p_manager_mutex);
            }
            opj_event_msg(job->p_manager, EVT_ERROR,
                          "Cannot allocate cblk->decoded_data\n");
            if (job->p_manager_mutex) {
                opj_mutex_unlock(job->p_manager_mutex);
            }
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
        /* Zero-init required */
        memset(cblk->decoded_data, 0, sizeof(OPJ_INT32) * cblk_w * cblk_h);
    } else if (cblk->decoded_data) {
        /* Not sure if that code path can happen, but better be */
        /* safe than sorry */
        opj_aligned_free(cblk->decoded_data);
        cblk->decoded_data = NULL;
    }

    resno = job->resno;
    band = job->band;
    tilec = job->tilec;
    tccp = job->tccp;
    tile_w = (OPJ_UINT32)(tilec->resolutions[tilec->minimum_num_resolutions - 1].x1
                          -
                          tilec->resolutions[tilec->minimum_num_resolutions - 1].x0);

    if (!*(job->pret)) {
        opj_free(job);
        return;
    }

    t1 = (opj_t1_t*) opj_tls_get(tls, OPJ_TLS_KEY_T1);
    if (t1 == NULL) {
        t1 = opj_t1_create(OPJ_FALSE);
        if (t1 == NULL) {
            opj_event_msg(job->p_manager, EVT_ERROR,
                          "Cannot allocate Tier 1 handle\n");
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
        if (!opj_tls_set(tls, OPJ_TLS_KEY_T1, t1, opj_t1_destroy_wrapper)) {
            opj_event_msg(job->p_manager, EVT_ERROR,
                          "Unable to set t1 handle as TLS\n");
            opj_t1_destroy(t1);
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
    }
    t1->mustuse_cblkdatabuffer = job->mustuse_cblkdatabuffer;

    if ((tccp->cblksty & J2K_CCP_CBLKSTY_HT) != 0) {
        if (OPJ_FALSE == opj_t1_ht_decode_cblk(
                    t1,
                    cblk,
                    band->bandno,
                    (OPJ_UINT32)tccp->roishift,
                    tccp->cblksty,
                    job->p_manager,
                    job->p_manager_mutex,
                    job->check_pterm)) {
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
    } else {
        if (OPJ_FALSE == opj_t1_decode_cblk(
                    t1,
                    cblk,
                    band->bandno,
                    (OPJ_UINT32)tccp->roishift,
                    tccp->cblksty,
                    job->p_manager,
                    job->p_manager_mutex,
                    job->check_pterm)) {
            *(job->pret) = OPJ_FALSE;
            opj_free(job);
            return;
        }
    }

    x = cblk->x0 - band->x0;
    y = cblk->y0 - band->y0;
    if (band->bandno & 1) {
        opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
        x += pres->x1 - pres->x0;
    }
    if (band->bandno & 2) {
        opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
        y += pres->y1 - pres->y0;
    }

    datap = cblk->decoded_data ? cblk->decoded_data : t1->data;
    cblk_w = t1->w;
    cblk_h = t1->h;

    if (tccp->roishift) {
        if (tccp->roishift >= 31) {
            for (j = 0; j < cblk_h; ++j) {
                for (i = 0; i < cblk_w; ++i) {
                    datap[(j * cblk_w) + i] = 0;
                }
            }
        } else {
            OPJ_INT32 thresh = 1 << tccp->roishift;
            for (j = 0; j < cblk_h; ++j) {
                for (i = 0; i < cblk_w; ++i) {
                    OPJ_INT32 val = datap[(j * cblk_w) + i];
                    OPJ_INT32 mag = abs(val);
                    if (mag >= thresh) {
                        mag >>= tccp->roishift;
                        datap[(j * cblk_w) + i] = val < 0 ? -mag : mag;
                    }
                }
            }
        }
    }

    /* Both can be non NULL if for example decoding a full tile and then */
    /* partially a tile. In which case partial decoding should be the */
    /* priority */
    assert((cblk->decoded_data != NULL) || (tilec->data != NULL));

    if (cblk->decoded_data) {
        OPJ_UINT32 cblk_size = cblk_w * cblk_h;
        if (tccp->qmfbid == 1) {
            for (i = 0; i < cblk_size; ++i) {
                datap[i] /= 2;
            }
        } else {        /* if (tccp->qmfbid == 0) */
            const float stepsize = 0.5f * band->stepsize;
            i = 0;
#ifdef __SSE2__
            {
                const __m128 xmm_stepsize = _mm_set1_ps(stepsize);
                for (; i < (cblk_size & ~15U); i += 16) {
                    __m128 xmm0_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 0)));
                    __m128 xmm1_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 4)));
                    __m128 xmm2_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 8)));
                    __m128 xmm3_data = _mm_cvtepi32_ps(_mm_load_si128((__m128i * const)(
                                                           datap + 12)));
                    _mm_store_ps((float*)(datap +  0), _mm_mul_ps(xmm0_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap +  4), _mm_mul_ps(xmm1_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap +  8), _mm_mul_ps(xmm2_data, xmm_stepsize));
                    _mm_store_ps((float*)(datap + 12), _mm_mul_ps(xmm3_data, xmm_stepsize));
                    datap += 16;
                }
            }
#endif
            for (; i < cblk_size; ++i) {
                OPJ_FLOAT32 tmp = ((OPJ_FLOAT32)(*datap)) * stepsize;
                memcpy(datap, &tmp, sizeof(tmp));
                datap++;
            }
        }
    } else if (tccp->qmfbid == 1) {
        OPJ_INT32* OPJ_RESTRICT tiledp = &tilec->data[(OPJ_SIZE_T)y * tile_w +
                                                       (OPJ_SIZE_T)x];
        for (j = 0; j < cblk_h; ++j) {
            i = 0;
            for (; i < (cblk_w & ~(OPJ_UINT32)3U); i += 4U) {
                OPJ_INT32 tmp0 = datap[(j * cblk_w) + i + 0U];
                OPJ_INT32 tmp1 = datap[(j * cblk_w) + i + 1U];
                OPJ_INT32 tmp2 = datap[(j * cblk_w) + i + 2U];
                OPJ_INT32 tmp3 = datap[(j * cblk_w) + i + 3U];
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 0U] = tmp0 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 1U] = tmp1 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 2U] = tmp2 / 2;
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i + 3U] = tmp3 / 2;
            }
            for (; i < cblk_w; ++i) {
                OPJ_INT32 tmp = datap[(j * cblk_w) + i];
                ((OPJ_INT32*)tiledp)[(j * (OPJ_SIZE_T)tile_w) + i] = tmp / 2;
            }
        }
    } else {        /* if (tccp->qmfbid == 0) */
        const float stepsize = 0.5f * band->stepsize;
        OPJ_FLOAT32* OPJ_RESTRICT tiledp = (OPJ_FLOAT32*) &tilec->data[(OPJ_SIZE_T)y *
                                                         tile_w + (OPJ_SIZE_T)x];
        for (j = 0; j < cblk_h; ++j) {
            OPJ_FLOAT32* OPJ_RESTRICT tiledp2 = tiledp;
            for (i = 0; i < cblk_w; ++i) {
                OPJ_FLOAT32 tmp = (OPJ_FLOAT32) * datap * stepsize;
                *tiledp2 = tmp;
                datap++;
                tiledp2++;
            }
            tiledp += tile_w;
        }
    }

    opj_free(job);
}